

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O2

void cLUWorkFree(int *iwork,singlecomplex *dwork,GlobalLU_t *Glu)

{
  int_t *piVar1;
  int iVar2;
  
  if (Glu->MemModel == SYSTEM) {
    superlu_free(iwork);
    superlu_free(dwork);
  }
  else {
    iVar2 = (Glu->stack).size;
    piVar1 = &(Glu->stack).used;
    *piVar1 = *piVar1 + ((Glu->stack).top2 - iVar2);
    (Glu->stack).top2 = iVar2;
  }
  superlu_free(Glu->expanders);
  Glu->expanders = (ExpHeader *)0x0;
  return;
}

Assistant:

void cLUWorkFree(int *iwork, singlecomplex *dwork, GlobalLU_t *Glu)
{
    if ( Glu->MemModel == SYSTEM ) {
	SUPERLU_FREE (iwork);
	SUPERLU_FREE (dwork);
    } else {
	Glu->stack.used -= (Glu->stack.size - Glu->stack.top2);
	Glu->stack.top2 = Glu->stack.size;
/*	cStackCompress(Glu);  */
    }
    
    SUPERLU_FREE (Glu->expanders);	
    Glu->expanders = NULL;
}